

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O1

size_t __thiscall booster::aio::stream_socket::bytes_readable(stream_socket *this,error_code *e)

{
  error_category *peVar1;
  uint in_EAX;
  native_type __fd;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  int size;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  __fd = basic_io_device::native((basic_io_device *)this);
  iVar2 = ioctl(__fd,0x541b,(long)&uStack_18 + 4);
  if (iVar2 < 0) {
    piVar4 = __errno_location();
    peVar1 = syscat;
    e->_M_value = *piVar4;
    e->_M_cat = peVar1;
    sVar3 = 0;
  }
  else {
    sVar3 = (size_t)uStack_18._4_4_;
  }
  return sVar3;
}

Assistant:

size_t stream_socket::bytes_readable(booster::system::error_code &e)
{
	#ifdef BOOSTER_WIN32
	unsigned long size = 0;
	int r = ::ioctlsocket(native(),FIONREAD,&size);
	if(r != 0) {
		e=geterror();
		return 0;
	}
	return size;
	#else
	int size = 0;
	int r = ::ioctl(native(),FIONREAD,&size);
	if(r < 0) {
		e=geterror();
		return 0;
	}
	return size;
	#endif
}